

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O1

int32_t uloc_forLanguageTag_63
                  (char *langtag,char *localeID,int32_t localeIDCapacity,int32_t *parsedLength,
                  UErrorCode *status)

{
  int32_t iVar1;
  
  iVar1 = ulocimp_forLanguageTag_63(langtag,-1,localeID,localeIDCapacity,parsedLength,status);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_forLanguageTag(const char* langtag,
                    char* localeID,
                    int32_t localeIDCapacity,
                    int32_t* parsedLength,
                    UErrorCode* status) {
    return ulocimp_forLanguageTag(
            langtag,
            -1,
            localeID,
            localeIDCapacity,
            parsedLength,
            status);
}